

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDrawLine(Image *dst,int startPosX,int startPosY,int endPosX,int endPosY,Color color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int x;
  int iVar4;
  int y;
  
  iVar1 = (endPosY - startPosY) * 2;
  iVar4 = endPosX - startPosX;
  iVar2 = iVar1 - iVar4;
  for (; startPosX <= endPosX; startPosX = startPosX + 1) {
    ImageDrawPixel(dst,startPosX,startPosY,color);
    iVar3 = iVar2 + iVar1;
    iVar2 = 0;
    if (-1 < iVar3) {
      iVar2 = iVar4 * 2;
    }
    iVar2 = iVar3 - iVar2;
    startPosY = startPosY + (uint)(-1 < iVar3);
  }
  return;
}

Assistant:

void ImageDrawLine(Image *dst, int startPosX, int startPosY, int endPosX, int endPosY, Color color)
{
    int m = 2*(endPosY - startPosY);
    int slopeError = m - (endPosX - startPosX);

    for (int x = startPosX, y = startPosY; x <= endPosX; x++)
    {
        ImageDrawPixel(dst, x, y, color);
        slopeError += m;

        if (slopeError >= 0)
        {
            y++;
            slopeError -= 2*(endPosX - startPosX);
        }
    }
}